

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int cmfm1b_(int *lot,int *jump,int *n,int *inc,fft_complex_t *c__,double *ch,double *wa,double *fnf,
           double *fac)

{
  double *wa_00;
  int iVar1;
  int iVar2;
  fft_complex_t *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  fft_complex_t *pfVar11;
  int *piVar12;
  int *piVar13;
  int na;
  int l1;
  int ido;
  int *local_78;
  int *local_70;
  int *local_68;
  fft_complex_t *local_60;
  fft_complex_t *local_58;
  int lid;
  int ip;
  ulong local_48;
  double *local_40;
  int *local_38;
  
  na = 0;
  l1 = 1;
  if (0 < (int)*fnf) {
    local_40 = wa + -1;
    local_48 = (ulong)(uint)(int)*fnf;
    uVar9 = 0;
    iVar8 = 1;
    iVar2 = 0;
    local_78 = lot;
    local_70 = jump;
    local_68 = inc;
    local_60 = c__;
    local_58 = (fft_complex_t *)ch;
    local_38 = n;
    do {
      iVar6 = (int)fac[uVar9];
      iVar5 = l1 * iVar6;
      iVar1 = *local_38 / iVar5;
      lid = l1 * iVar1;
      iVar4 = 6;
      if (iVar6 < 6) {
        iVar4 = iVar6;
      }
      wa_00 = local_40 + iVar8;
      ido = iVar1;
      ip = iVar6;
      switch(iVar2 + iVar4 * 2) {
      case 5:
        piVar7 = &c__1;
        pfVar3 = local_58;
        piVar10 = local_78;
        pfVar11 = local_60;
        piVar12 = local_70;
        piVar13 = local_68;
        break;
      case 6:
        piVar12 = &c__1;
        pfVar3 = local_60;
        piVar7 = local_70;
        piVar10 = local_68;
        pfVar11 = local_58;
        piVar13 = local_78;
        goto LAB_0010f73a;
      case 7:
        pfVar3 = local_58;
        piVar7 = &c__1;
        piVar10 = local_78;
        pfVar11 = local_60;
        piVar12 = local_70;
        piVar13 = local_68;
LAB_0010f73a:
        cmf3kb_(local_78,&ido,&l1,&na,&pfVar3->r,piVar7,piVar10,&pfVar11->r,piVar12,piVar13,wa_00);
        goto LAB_0010f840;
      case 8:
        piVar12 = &c__1;
        pfVar3 = local_60;
        piVar7 = local_70;
        piVar10 = local_68;
        pfVar11 = local_58;
        piVar13 = local_78;
        goto LAB_0010f6b7;
      case 9:
        pfVar3 = local_58;
        piVar7 = &c__1;
        piVar10 = local_78;
        pfVar11 = local_60;
        piVar12 = local_70;
        piVar13 = local_68;
LAB_0010f6b7:
        cmf4kb_(local_78,&ido,&l1,&na,&pfVar3->r,piVar7,piVar10,&pfVar11->r,piVar12,piVar13,wa_00);
        goto LAB_0010f840;
      case 10:
        piVar12 = &c__1;
        pfVar3 = local_60;
        piVar7 = local_70;
        piVar10 = local_68;
        pfVar11 = local_58;
        piVar13 = local_78;
        goto LAB_0010f7ac;
      case 0xb:
        pfVar3 = local_58;
        piVar7 = &c__1;
        piVar10 = local_78;
        pfVar11 = local_60;
        piVar12 = local_70;
        piVar13 = local_68;
LAB_0010f7ac:
        cmf5kb_(local_78,&ido,&l1,&na,&pfVar3->r,piVar7,piVar10,&pfVar11->r,piVar12,piVar13,wa_00);
        goto LAB_0010f840;
      case 0xc:
        piVar12 = &c__1;
        pfVar3 = local_60;
        piVar7 = local_70;
        piVar10 = local_68;
        pfVar11 = local_58;
        piVar13 = local_78;
        goto LAB_0010f7f6;
      case 0xd:
        pfVar3 = local_58;
        piVar7 = &c__1;
        piVar10 = local_78;
        pfVar11 = local_60;
        piVar12 = local_70;
        piVar13 = local_68;
LAB_0010f7f6:
        cmfgkb_(local_78,&ido,&ip,&l1,&lid,&na,&pfVar3->r,&pfVar3->r,piVar7,piVar10,&pfVar11->r,
                &pfVar11->r,piVar12,piVar13,wa_00);
        goto LAB_0010f840;
      default:
        pfVar3 = local_60;
        piVar7 = local_70;
        piVar10 = local_68;
        pfVar11 = local_58;
        piVar12 = &c__1;
        piVar13 = local_78;
      }
      cmf2kb_(local_78,&ido,&l1,&na,&pfVar3->r,piVar7,piVar10,&pfVar11->r,piVar12,piVar13,wa_00);
LAB_0010f840:
      if (iVar6 < 6) {
        iVar2 = 1 - iVar2;
        na = iVar2;
      }
      iVar8 = iVar8 + (iVar6 * 2 + -2) * iVar1;
      uVar9 = uVar9 + 1;
      l1 = iVar5;
    } while (local_48 != uVar9);
  }
  return 0;
}

Assistant:

int cmfm1b_(int *lot, int *jump, int *n, int
	*inc, complex *c__, fft_real_t *ch, fft_real_t *wa, fft_real_t *fnf, fft_real_t *fac)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
     int k1, l1, l2, na, nf, ip, iw, lid, ido, nbr;
    extern /* Subroutine */ int cmf2kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf3kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf4kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf5kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmfgkb_(int *, int *, int *,
	    int *, int *, int *, fft_real_t *, fft_real_t *, int *,
	    int *, fft_real_t *, fft_real_t *, int *, int *, fft_real_t *);


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    --fac;
    --wa;
    --ch;
    --c__;

    /* Function Body */
    nf = *fnf;
    na = 0;
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1];
	l2 = ip * l1;
	ido = *n / l2;
	lid = l1 * ido;
/* Computing MIN */
	i__2 = ip - 2;
	nbr = na + 1 + (min(i__2,4) << 1);
	switch (nbr) {
	    case 1:  goto L52;
	    case 2:  goto L62;
	    case 3:  goto L53;
	    case 4:  goto L63;
	    case 5:  goto L54;
	    case 6:  goto L64;
	    case 7:  goto L55;
	    case 8:  goto L65;
	    case 9:  goto L56;
	    case 10:  goto L66;
	}
L52:
	cmf2kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L62:
	cmf2kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L53:
	cmf3kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L63:
	cmf3kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L54:
	cmf4kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L64:
	cmf4kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L55:
	cmf5kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L65:
	cmf5kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L56:
	cmfgkb_(lot, &ido, &ip, &l1, &lid, &na, (fft_real_t*)&c__[1], (fft_real_t*)&c__[1]
		, jump, inc, &ch[1], &ch[1], &c__1, lot, &wa[iw]);
	goto L120;
L66:
	cmfgkb_(lot, &ido, &ip, &l1, &lid, &na, &ch[1], &ch[1], &c__1, lot, (
		fft_real_t*)&c__[1], (fft_real_t*)&c__[1], jump, inc, &wa[iw]);
L120:
	l1 = l2;
	iw += (ip - 1) * (ido + ido);
	if (ip <= 5) {
	    na = 1 - na;
	}
/* L125: */
    }
    return 0;
}